

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_stack.c
# Opt level: O0

void l2_stack_push_back(l2_stack *stack,void *data)

{
  l2_storage *storage_p;
  l2_stack_size lVar1;
  void *pvVar2;
  l2_stack_size lVar3;
  int local_1c;
  int i;
  void *data_local;
  l2_stack *stack_local;
  
  l2_assert_func((long)stack,L2_INTERNAL_ERROR_NULL_POINTER,"l2_stack_push_back",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_tpl/l2_stack.c"
                 ,0x1c);
  if (stack->max_size <= stack->size) {
    storage_p = g_parser_p->storage_p;
    lVar1 = stack->max_size;
    lVar3 = stack->max_size + 100;
    stack->max_size = lVar3;
    pvVar2 = l2_storage_mem_resize
                       (storage_p,stack->stack_p,lVar1 * stack->single_size,
                        lVar3 * stack->single_size);
    stack->stack_p = pvVar2;
  }
  for (local_1c = 0; (ulong)(long)local_1c < stack->single_size; local_1c = local_1c + 1) {
    *(undefined1 *)((long)stack->stack_p + stack->size * stack->single_size + (long)local_1c) =
         *(undefined1 *)((long)data + (long)local_1c);
  }
  stack->size = stack->size + 1;
  return;
}

Assistant:

void l2_stack_push_back(l2_stack *stack, const void *data) {
    l2_assert(stack, L2_INTERNAL_ERROR_NULL_POINTER);
    int i;
    if (stack->size >= stack->max_size)
        stack->stack_p = l2_storage_mem_resize(g_parser_p->storage_p, stack->stack_p, stack->max_size * stack->single_size, (stack->max_size += 100) * stack->single_size);
    for (i = 0; i < stack->single_size; i++) {
        ((char *)(stack->stack_p))[stack->size * stack->single_size + i] = ((char *)data)[i];
    }
    stack->size += 1;
}